

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cortex.cpp
# Opt level: O3

void LogMessage(int iLevel,char *szMsg,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *str_tmp;
  va_list arg_list;
  char *local_f0;
  undefined8 local_e8;
  char **local_e0;
  undefined1 *local_d8;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  if (iLevel <= User_VerbosityLevel) {
    local_f0 = (char *)0x0;
    local_d8 = local_c8;
    local_e0 = &str_tmp;
    local_e8 = 0x3000000010;
    local_b8 = in_RDX;
    local_b0 = in_RCX;
    local_a8 = in_R8;
    local_a0 = in_R9;
    vasprintf(&local_f0,szMsg,&local_e8);
    (*CB_ErrorMsgHandler)(iLevel,local_f0);
    free(local_f0);
  }
  return;
}

Assistant:

void LogMessage(int iLevel, const char *szMsg, ...)
{
  if (iLevel <= User_VerbosityLevel) {
    // create char* from input
    char* str_tmp = NULL;
    va_list arg_list;
    va_start(arg_list, szMsg);
    (void) vasprintf(&str_tmp, szMsg, arg_list);
    CB_ErrorMsgHandler(iLevel, str_tmp);
    free(str_tmp);
  }
}